

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QList<unsigned_short>_>::copyAppend
          (QGenericArrayOps<QList<unsigned_short>_> *this,QList<unsigned_short> *b,
          QList<unsigned_short> *e)

{
  QList<unsigned_short> *this_00;
  ulong in_RDX;
  ulong in_RSI;
  QList<unsigned_short> *in_RDI;
  QList<unsigned_short> *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QList<unsigned_short>_>::begin
                        ((QArrayDataPointer<QList<unsigned_short>_> *)0xb81ca7);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QList<unsigned_short>::QList(this_00,in_RDI);
      local_10 = local_10 + 0x18;
      (in_RDI->d).size = (in_RDI->d).size + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }